

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O3

void rgbx_8888_to_rgb_565
               (void *src,int src_pitch,void *dst,int dst_pitch,int sx,int sy,int dx,int dy,
               int width,int height)

{
  ushort *puVar1;
  uint uVar2;
  ushort *puVar3;
  uint *puVar4;
  int iVar5;
  int iVar6;
  
  if (0 < height) {
    puVar3 = (ushort *)((long)dst + (long)dx * 2 + (long)(dy * dst_pitch));
    puVar4 = (uint *)((long)src + (long)sx * 4 + (long)(sy * src_pitch));
    iVar5 = src_pitch + 3;
    if (-1 < src_pitch) {
      iVar5 = src_pitch;
    }
    iVar6 = 0;
    do {
      if (0 < width) {
        puVar1 = puVar3 + width;
        do {
          uVar2 = *puVar4;
          *puVar3 = (ushort)(uVar2 >> 0x10) & 0xf800 |
                    (ushort)(uVar2 >> 0xd) & 0x7e0 | (ushort)(uVar2 >> 0xb) & 0x1f;
          puVar3 = puVar3 + 1;
          puVar4 = puVar4 + 1;
        } while (puVar3 < puVar1);
      }
      puVar4 = puVar4 + ((iVar5 >> 2) - width);
      puVar3 = puVar3 + (dst_pitch / 2 - width);
      iVar6 = iVar6 + 1;
    } while (iVar6 != height);
  }
  return;
}

Assistant:

static void rgbx_8888_to_rgb_565(const void *src, int src_pitch,
   void *dst, int dst_pitch,
   int sx, int sy, int dx, int dy, int width, int height)
{
   int y;
   const uint32_t *src_ptr = (const uint32_t *)((const char *)src + sy * src_pitch);
   uint16_t *dst_ptr = (void *)((char *)dst + dy * dst_pitch);
   int src_gap = src_pitch / 4 - width;
   int dst_gap = dst_pitch / 2 - width;
   src_ptr += sx;
   dst_ptr += dx;
   for (y = 0; y < height; y++) {
      uint16_t *dst_end = dst_ptr + width;
      while (dst_ptr < dst_end) {
         *dst_ptr = ALLEGRO_CONVERT_RGBX_8888_TO_RGB_565(*src_ptr);
         dst_ptr++;
         src_ptr++;
      }
      src_ptr += src_gap;
      dst_ptr += dst_gap;
   }
}